

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CLayerGroup::GetSize(CLayerGroup *this,float *w,float *h)

{
  int iVar1;
  CLayer **ppCVar2;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  float fVar3;
  int i;
  float lh;
  float lw;
  int local_2c;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RSI = 0.0;
  *in_RDX = 0.0;
  local_2c = 0;
  while( true ) {
    iVar1 = array<CLayer_*,_allocator_default<CLayer_*>_>::size
                      ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 8));
    if (iVar1 <= local_2c) break;
    ppCVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                        ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 8),local_2c);
    (*(*ppCVar2)->_vptr_CLayer[0xe])(*ppCVar2,&local_c,&local_10);
    fVar3 = maximum<float>(*in_RSI,local_c);
    *in_RSI = fVar3;
    fVar3 = maximum<float>(*in_RDX,local_10);
    *in_RDX = fVar3;
    local_2c = local_2c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLayerGroup::GetSize(float *w, float *h) const
{
	*w = 0; *h = 0;
	for(int i = 0; i < m_lLayers.size(); i++)
	{
		float lw, lh;
		m_lLayers[i]->GetSize(&lw, &lh);
		*w = maximum(*w, lw);
		*h = maximum(*h, lh);
	}
}